

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

bool __thiscall cppjieba::MPSegment::IsUserDictSingleChineseWord(MPSegment *this,Rune *value)

{
  bool bVar1;
  Rune *value_local;
  MPSegment *this_local;
  
  bVar1 = DictTrie::IsUserDictSingleChineseWord(this->dictTrie_,value);
  return bVar1;
}

Assistant:

bool IsUserDictSingleChineseWord(const Rune& value) const {
    return dictTrie_->IsUserDictSingleChineseWord(value);
  }